

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

type * __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
as<(anonymous_namespace)::ns::Project<std::set<(anonymous_namespace)::ns::Value,std::less<(anonymous_namespace)::ns::Value>,std::allocator<(anonymous_namespace)::ns::Value>>>>
          (type *__return_storage_ptr__,
          basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this_00;
  iterator this_01;
  conv_error *pcVar3;
  error_category *peVar4;
  error_code ec;
  error_code ec_00;
  const_array_range_type cVar5;
  undefined1 local_98 [8];
  undefined1 local_90 [24];
  _Base_ptr local_78;
  size_t local_70;
  type local_68;
  string_view_type local_40;
  
  bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
  if (!bVar2) {
    pcVar3 = (conv_error *)__cxa_allocate_exception(0x58);
    peVar4 = conv_error_category();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_98,"Not a ns::Project",(allocator<char> *)&local_68);
    ec._M_cat = peVar4;
    ec._0_8_ = 1;
    conv_error::conv_error(pcVar3,ec,(string *)local_98);
    __cxa_throw(pcVar3,&conv_error::typeinfo,conv_error::~conv_error);
  }
  __return_storage_ptr__->version = 1;
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->author)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->author).field_2;
  (__return_storage_ptr__->author)._M_string_length = 0;
  (__return_storage_ptr__->author).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->notes)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->notes).field_2;
  (__return_storage_ptr__->notes)._M_string_length = 0;
  (__return_storage_ptr__->notes).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->showNotes = false;
  p_Var1 = &(__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(__return_storage_ptr__->values)._M_t._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98 = (undefined1  [8])0x7;
  local_90._0_8_ = "version";
  bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)local_98);
  if (bVar2) {
    local_98 = (undefined1  [8])0x7;
    local_90._0_8_ = "version";
    json_traits_helper<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
    ::set_udt_member<int>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
               (string_view_type *)local_98,&__return_storage_ptr__->version);
  }
  local_98 = (undefined1  [8])0x4;
  local_90._0_8_ = "name";
  bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)local_98);
  if (bVar2) {
    local_98 = (undefined1  [8])0x4;
    local_90._0_8_ = "name";
    json_traits_helper<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
    set_udt_member<std::__cxx11::string>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
               (string_view_type *)local_98,&__return_storage_ptr__->name);
  }
  local_98 = (undefined1  [8])&DAT_00000006;
  local_90._0_8_ = "author";
  bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)local_98);
  if (bVar2) {
    local_98 = (undefined1  [8])&DAT_00000006;
    local_90._0_8_ = "author";
    json_traits_helper<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
    set_udt_member<std::__cxx11::string>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
               (string_view_type *)local_98,&__return_storage_ptr__->author);
  }
  local_98 = (undefined1  [8])&DAT_00000005;
  local_90._0_8_ = "notes";
  bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)local_98);
  if (bVar2) {
    local_98 = (undefined1  [8])&DAT_00000005;
    local_90._0_8_ = "notes";
    json_traits_helper<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
    set_udt_member<std::__cxx11::string>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
               (string_view_type *)local_98,&__return_storage_ptr__->notes);
  }
  local_98 = (undefined1  [8])0x9;
  local_90._0_8_ = "showNotes";
  bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)local_98);
  if (bVar2) {
    local_98 = (undefined1  [8])0x9;
    local_90._0_8_ = "showNotes";
    json_traits_helper<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
    ::set_udt_member<bool>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
               (string_view_type *)local_98,&__return_storage_ptr__->showNotes);
  }
  local_98 = (undefined1  [8])&DAT_00000006;
  local_90._0_8_ = "values";
  bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)local_98);
  if (bVar2) {
    local_40._M_len = 6;
    local_40._M_str = "values";
    this_00 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                         &local_40);
    bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array(this_00);
    if (!bVar2) {
      pcVar3 = (conv_error *)__cxa_allocate_exception(0x58);
      peVar4 = conv_error_category();
      ec_00._M_cat = peVar4;
      ec_00._0_8_ = 4;
      conv_error::conv_error(pcVar3,ec_00);
      __cxa_throw(pcVar3,&conv_error::typeinfo,conv_error::~conv_error);
    }
    local_90._16_8_ = local_90;
    local_90._0_8_ = local_90._0_8_ & 0xffffffff00000000;
    local_90._8_8_ = (_Base_ptr)0x0;
    local_70 = 0;
    local_78 = (_Base_ptr)local_90._16_8_;
    cVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range(this_00);
    for (this_01 = cVar5.first_._M_current; this_01._M_current != cVar5.last_._M_current._M_current;
        this_01._M_current = this_01._M_current + 1) {
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
      as<(anonymous_namespace)::ns::Value>(&local_68,this_01._M_current);
      std::
      set<(anonymous_namespace)::ns::Value,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>
      ::insert((set<(anonymous_namespace)::ns::Value,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>
                *)local_98,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
    }
    std::
    _Rb_tree<(anonymous_namespace)::ns::Value,_(anonymous_namespace)::ns::Value,_std::_Identity<(anonymous_namespace)::ns::Value>,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ::operator=(&(__return_storage_ptr__->values)._M_t,
                (_Rb_tree<(anonymous_namespace)::ns::Value,_(anonymous_namespace)::ns::Value,_std::_Identity<(anonymous_namespace)::ns::Value>,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>
                 *)local_98);
    std::
    _Rb_tree<(anonymous_namespace)::ns::Value,_(anonymous_namespace)::ns::Value,_std::_Identity<(anonymous_namespace)::ns::Value>,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ::~_Rb_tree((_Rb_tree<(anonymous_namespace)::ns::Value,_(anonymous_namespace)::ns::Value,_std::_Identity<(anonymous_namespace)::ns::Value>,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>
                 *)local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

typename std::enable_if<is_json_type_traits_specialized<basic_json,T>::value,T>::type
        as() const
        {
            T val = json_type_traits<basic_json,T>::as(*this);
            return val;
        }